

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlineedit.cpp
# Opt level: O3

void QLineEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  InputMethodQuery property;
  uint *puVar1;
  code *pcVar2;
  int *piVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  byte bVar8;
  uint uVar9;
  long lVar10;
  QArrayData *pQVar11;
  undefined4 uVar12;
  int iVar13;
  undefined4 in_register_00000014;
  int pos;
  QString *placeholderText;
  QWidgetLineControl *pQVar14;
  long in_FS_OFFSET;
  bool bVar15;
  QVariant in_stack_ffffffffffffff88;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_58._8_8_ = _a[1];
      iVar13 = 0;
      goto LAB_0041d759;
    case 1:
      local_58._8_8_ = _a[1];
      iVar13 = 1;
LAB_0041d759:
      local_58.shared = (PrivateShared *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,iVar13,&local_58.shared);
      goto switchD_0041d1c1_caseD_3;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        cursorPositionChanged((QLineEdit *)_o,*_a[1],*_a[2]);
        return;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        iVar13 = 3;
LAB_0041d7dd:
        QMetaObject::activate(_o,&staticMetaObject,iVar13,(void **)0x0);
        return;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        iVar13 = 4;
        goto LAB_0041d7dd;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        iVar13 = 5;
        goto LAB_0041d7dd;
      }
      break;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        iVar13 = 6;
        goto LAB_0041d7dd;
      }
      break;
    case 7:
      placeholderText = (QString *)_a[1];
switchD_0041d221_caseD_1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QLineEditPrivate::setText(*(QLineEditPrivate **)(_o + 8),placeholderText);
        return;
      }
      break;
    case 8:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        clear((QLineEdit *)_o);
        return;
      }
      break;
    case 9:
      pQVar14 = *(QWidgetLineControl **)(*(long *)(_o + 8) + 600);
      *(undefined4 *)(pQVar14 + 0x40) = 0;
      *(undefined8 *)(pQVar14 + 0x110) = 0;
      pos = *(int *)(pQVar14 + 0x28);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        bVar15 = true;
LAB_0041d639:
        QWidgetLineControl::moveCursor(pQVar14,pos,bVar15);
        return;
      }
      break;
    case 10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        undo((QLineEdit *)_o);
        return;
      }
      break;
    case 0xb:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        redo((QLineEdit *)_o);
        return;
      }
      break;
    case 0xc:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        cut((QLineEdit *)_o);
        return;
      }
      break;
    case 0xd:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QWidgetLineControl::copy
                  (*(QWidgetLineControl **)(*(long *)(_o + 8) + 600),(EVP_PKEY_CTX *)0x0,
                   (EVP_PKEY_CTX *)CONCAT44(in_register_00000014,_id));
        return;
      }
      break;
    case 0xe:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QWidgetLineControl::paste(*(QWidgetLineControl **)(*(long *)(_o + 8) + 600),Clipboard);
        return;
      }
      break;
    case 0xf:
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      property = *_a[1];
      ::QVariant::QVariant((QVariant *)&stack0xffffffffffffff88,(QVariant *)_a[2]);
      inputMethodQuery((QVariant *)&local_58,(QLineEdit *)_o,property,in_stack_ffffffffffffff88);
      ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffff88);
      if ((QVariant *)*_a != (QVariant *)0x0) {
        ::QVariant::operator=((QVariant *)*_a,(QVariant *)&local_58);
      }
      ::QVariant::~QVariant((QVariant *)&local_58);
    default:
      goto switchD_0041d1c1_caseD_3;
    }
    goto LAB_0041db19;
  case ReadProperty:
    if (0x12 < (uint)_id) goto switchD_0041d1c1_caseD_3;
    puVar1 = (uint *)*_a;
    switch(_id) {
    case 0:
      QWidgetLineControl::inputMask
                ((QString *)&local_58,*(QWidgetLineControl **)(*(long *)(_o + 8) + 600));
      goto LAB_0041d9c6;
    case 1:
      QWidgetLineControl::text
                ((QString *)&local_58,*(QWidgetLineControl **)(*(long *)(_o + 8) + 600));
      goto LAB_0041d9c6;
    case 2:
      uVar9 = *(uint *)(*(long *)(*(long *)(_o + 8) + 600) + 0x60);
      break;
    case 3:
      bVar8 = *(byte *)(*(long *)(_o + 8) + 0x27c);
      goto LAB_0041d962;
    case 4:
      uVar9 = *(uint *)(*(long *)(*(long *)(_o + 8) + 600) + 0x50) >> 4 & 3;
      break;
    case 5:
      QTextLayout::text();
LAB_0041d9c6:
      pQVar11 = *(QArrayData **)puVar1;
      *(PrivateShared **)puVar1 = local_58.shared;
      puVar6 = *(undefined1 **)(puVar1 + 2);
      *(undefined8 *)(puVar1 + 2) = local_58._8_8_;
      puVar7 = *(undefined1 **)(puVar1 + 4);
      *(undefined8 *)(puVar1 + 4) = local_58._16_8_;
      local_58._8_8_ = puVar6;
      local_58._16_8_ = puVar7;
LAB_0041da90:
      local_58.shared = (PrivateShared *)pQVar11;
      if (pQVar11 != (QArrayData *)0x0) {
        LOCK();
        (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar11->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar11,2,0x10);
        }
      }
      goto switchD_0041d1c1_caseD_3;
    case 6:
      uVar9 = *(uint *)(*(long *)(*(long *)(_o + 8) + 600) + 0x40);
      break;
    case 7:
      uVar9 = *(uint *)(*(long *)(_o + 8) + 0x288);
      break;
    case 8:
      bVar15 = *(int *)(*(long *)(*(long *)(_o + 8) + 600) + 0xf0) ==
               *(int *)(*(long *)(*(long *)(_o + 8) + 600) + 0xf4);
      goto LAB_0041dac7;
    case 9:
      lVar10 = *(long *)(*(long *)(_o + 8) + 600);
      bVar15 = *(int *)(lVar10 + 0x110) < *(int *)(lVar10 + 0x114) && *(long *)(lVar10 + 0x28) != 0;
      goto LAB_0041da07;
    case 10:
      selectedText((QString *)&local_58,(QLineEdit *)_o);
      pQVar11 = *(QArrayData **)puVar1;
      *(PrivateShared **)puVar1 = local_58.shared;
      puVar6 = *(undefined1 **)(puVar1 + 2);
      *(undefined8 *)(puVar1 + 2) = local_58._8_8_;
      puVar7 = *(undefined1 **)(puVar1 + 4);
      *(undefined8 *)(puVar1 + 4) = local_58._16_8_;
      local_58._8_8_ = puVar6;
      local_58._16_8_ = puVar7;
      goto LAB_0041da90;
    case 0xb:
      bVar8 = *(byte *)(*(long *)(_o + 8) + 0x27c) >> 3;
      goto LAB_0041d962;
    case 0xc:
      bVar8 = *(byte *)(*(long *)(*(long *)(_o + 8) + 600) + 0x50) >> 2;
LAB_0041d962:
      bVar15 = (bool)(bVar8 & 1);
      goto LAB_0041da07;
    case 0xd:
      bVar15 = QWidgetLineControl::isUndoAvailable
                         (*(QWidgetLineControl **)(*(long *)(_o + 8) + 600));
      goto LAB_0041da07;
    case 0xe:
      bVar15 = QWidgetLineControl::isRedoAvailable
                         (*(QWidgetLineControl **)(*(long *)(_o + 8) + 600));
      goto LAB_0041da07;
    case 0xf:
      bVar15 = QWidgetLineControl::hasAcceptableInput
                         (*(QWidgetLineControl **)(*(long *)(_o + 8) + 600),
                          (QString *)(*(QWidgetLineControl **)(*(long *)(_o + 8) + 600) + 0x18));
LAB_0041da07:
      *(bool *)puVar1 = bVar15;
      goto switchD_0041d1c1_caseD_3;
    case 0x10:
      lVar10 = *(long *)(_o + 8);
      piVar3 = *(int **)(lVar10 + 0x2a8);
      uVar4 = *(undefined8 *)(lVar10 + 0x2b0);
      uVar5 = *(undefined8 *)(lVar10 + 0x2b8);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      pQVar11 = *(QArrayData **)puVar1;
      *(int **)puVar1 = piVar3;
      *(undefined8 *)(puVar1 + 2) = uVar4;
      *(undefined8 *)(puVar1 + 4) = uVar5;
      if (pQVar11 != (QArrayData *)0x0) {
        LOCK();
        (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar11->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
            QArrayData::deallocate(pQVar11,2,0x10);
            return;
          }
          goto LAB_0041db19;
        }
      }
      goto switchD_0041d1c1_caseD_3;
    case 0x11:
      uVar9 = QTextLayout::cursorMoveStyle();
      break;
    case 0x12:
      lVar10 = qt_qFindChild_helper
                         (_o,"_q_qlineeditclearaction",0x4000000000000017,&QAction::staticMetaObject
                          ,1);
      bVar15 = lVar10 == 0;
LAB_0041dac7:
      *(bool *)puVar1 = !bVar15;
      goto switchD_0041d1c1_caseD_3;
    }
    *puVar1 = uVar9;
    goto switchD_0041d1c1_caseD_3;
  case WriteProperty:
    if (0x12 < (uint)_id) goto switchD_0041d1c1_caseD_3;
    break;
  default:
    goto switchD_0041d1c1_caseD_3;
  case IndexOfMethod:
    pcVar2 = *_a[1];
    lVar10 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == textChanged && lVar10 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar2 == textEdited && lVar10 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar2 == cursorPositionChanged && lVar10 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar2 == returnPressed && lVar10 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (pcVar2 == editingFinished && lVar10 == 0) {
      *(undefined4 *)*_a = 4;
    }
    else if (pcVar2 == selectionChanged && lVar10 == 0) {
      *(undefined4 *)*_a = 5;
    }
    else if (pcVar2 == inputRejected && lVar10 == 0) {
      *(undefined4 *)*_a = 6;
    }
    goto switchD_0041d1c1_caseD_3;
  }
  placeholderText = (QString *)*_a;
  switch(_id) {
  case 0:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QWidgetLineControl::setInputMask
                (*(QWidgetLineControl **)(*(long *)(_o + 8) + 600),placeholderText);
      return;
    }
    break;
  case 1:
    goto switchD_0041d221_caseD_1;
  case 2:
    pQVar14 = *(QWidgetLineControl **)(*(long *)(_o + 8) + 600);
    if (*(long *)(pQVar14 + 0xe8) == 0) {
      *(undefined4 *)(pQVar14 + 0x60) = *(undefined4 *)&(placeholderText->d).d;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QWidgetLineControl::setText(pQVar14,(QString *)(pQVar14 + 0x18));
        return;
      }
      break;
    }
    goto switchD_0041d1c1_caseD_3;
  case 3:
    *(byte *)(*(long *)(_o + 8) + 0x27c) =
         *(byte *)(*(long *)(_o + 8) + 0x27c) & 0xfe | *(byte *)&(placeholderText->d).d;
    QWidget::update((QWidget *)_o);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QWidget::updateGeometry((QWidget *)_o);
      return;
    }
    break;
  case 4:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      setEchoMode((QLineEdit *)_o,*(EchoMode *)&(placeholderText->d).d);
      return;
    }
    break;
  default:
    goto switchD_0041d1c1_caseD_3;
  case 6:
    iVar13 = *(int *)&(placeholderText->d).d;
    pQVar14 = *(QWidgetLineControl **)(*(long *)(_o + 8) + 600);
    if ((long)iVar13 <= *(long *)(pQVar14 + 0x28)) {
      pos = 0;
      if (0 < iVar13) {
        pos = iVar13;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        bVar15 = false;
        goto LAB_0041d639;
      }
      break;
    }
    goto switchD_0041d1c1_caseD_3;
  case 7:
    *(undefined4 *)(*(long *)(_o + 8) + 0x288) = *(undefined4 *)&(placeholderText->d).d;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QWidget::update((QWidget *)_o);
      return;
    }
    break;
  case 8:
    uVar12 = 0xffffffff;
    if (*(char *)&(placeholderText->d).d == '\0') {
      uVar12 = *(undefined4 *)(*(long *)(*(long *)(_o + 8) + 600) + 0xf4);
    }
    *(undefined4 *)(*(long *)(*(long *)(_o + 8) + 600) + 0xf0) = uVar12;
    goto switchD_0041d1c1_caseD_3;
  case 0xb:
    *(byte *)(*(long *)(_o + 8) + 0x27c) =
         *(byte *)(*(long *)(_o + 8) + 0x27c) & 0xf7 | *(char *)&(placeholderText->d).d << 3;
switchD_0041d1c1_caseD_3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
    break;
  case 0xc:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      setReadOnly((QLineEdit *)_o,*(bool *)&(placeholderText->d).d);
      return;
    }
    break;
  case 0x10:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      setPlaceholderText((QLineEdit *)_o,placeholderText);
      return;
    }
    break;
  case 0x11:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QTextLayout::setCursorMoveStyle((int)*(undefined8 *)(*(long *)(_o + 8) + 600) + 0x118);
      return;
    }
    break;
  case 0x12:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      setClearButtonEnabled((QLineEdit *)_o,*(bool *)&(placeholderText->d).d);
      return;
    }
  }
LAB_0041db19:
  __stack_chk_fail();
}

Assistant:

void QLineEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QLineEdit *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->textChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->textEdited((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: _t->cursorPositionChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 3: _t->returnPressed(); break;
        case 4: _t->editingFinished(); break;
        case 5: _t->selectionChanged(); break;
        case 6: _t->inputRejected(); break;
        case 7: _t->setText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 8: _t->clear(); break;
        case 9: _t->selectAll(); break;
        case 10: _t->undo(); break;
        case 11: _t->redo(); break;
        case 12: _t->cut(); break;
        case 13: _t->copy(); break;
        case 14: _t->paste(); break;
        case 15: { QVariant _r = _t->inputMethodQuery((*reinterpret_cast< std::add_pointer_t<Qt::InputMethodQuery>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)(const QString & )>(_a, &QLineEdit::textChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)(const QString & )>(_a, &QLineEdit::textEdited, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)(int , int )>(_a, &QLineEdit::cursorPositionChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)()>(_a, &QLineEdit::returnPressed, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)()>(_a, &QLineEdit::editingFinished, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)()>(_a, &QLineEdit::selectionChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)()>(_a, &QLineEdit::inputRejected, 6))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->inputMask(); break;
        case 1: *reinterpret_cast<QString*>(_v) = _t->text(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->maxLength(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->hasFrame(); break;
        case 4: *reinterpret_cast<EchoMode*>(_v) = _t->echoMode(); break;
        case 5: *reinterpret_cast<QString*>(_v) = _t->displayText(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->cursorPosition(); break;
        case 7: *reinterpret_cast<Qt::Alignment*>(_v) = _t->alignment(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->isModified(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->hasSelectedText(); break;
        case 10: *reinterpret_cast<QString*>(_v) = _t->selectedText(); break;
        case 11: *reinterpret_cast<bool*>(_v) = _t->dragEnabled(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->isReadOnly(); break;
        case 13: *reinterpret_cast<bool*>(_v) = _t->isUndoAvailable(); break;
        case 14: *reinterpret_cast<bool*>(_v) = _t->isRedoAvailable(); break;
        case 15: *reinterpret_cast<bool*>(_v) = _t->hasAcceptableInput(); break;
        case 16: *reinterpret_cast<QString*>(_v) = _t->placeholderText(); break;
        case 17: *reinterpret_cast<Qt::CursorMoveStyle*>(_v) = _t->cursorMoveStyle(); break;
        case 18: *reinterpret_cast<bool*>(_v) = _t->isClearButtonEnabled(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setInputMask(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setText(*reinterpret_cast<QString*>(_v)); break;
        case 2: _t->setMaxLength(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setFrame(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setEchoMode(*reinterpret_cast<EchoMode*>(_v)); break;
        case 6: _t->setCursorPosition(*reinterpret_cast<int*>(_v)); break;
        case 7: _t->setAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 8: _t->setModified(*reinterpret_cast<bool*>(_v)); break;
        case 11: _t->setDragEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 12: _t->setReadOnly(*reinterpret_cast<bool*>(_v)); break;
        case 16: _t->setPlaceholderText(*reinterpret_cast<QString*>(_v)); break;
        case 17: _t->setCursorMoveStyle(*reinterpret_cast<Qt::CursorMoveStyle*>(_v)); break;
        case 18: _t->setClearButtonEnabled(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}